

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::InvalidateSubDataTest::CheckErrorAndLog
          (InvalidateSubDataTest *this,GLenum *attachments,GLuint count)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_240;
  MessageBuilder local_230;
  GetNameFunc local_b0;
  int local_a8;
  GetNameFunc local_a0;
  int local_98;
  string local_90;
  uint local_70;
  GLuint i;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string attachments_names;
  GLenum error;
  Functions *gl;
  GLuint count_local;
  GLenum *attachments_local;
  InvalidateSubDataTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  attachments_names.field_2._12_4_ = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (attachments_names.field_2._12_4_ == 0) {
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"",&local_59);
    std::allocator<char>::~allocator(&local_59);
    for (local_70 = 0; local_70 < count; local_70 = local_70 + 1) {
      EVar4 = glu::getFramebufferAttachmentStr(attachments[local_70]);
      local_b0 = EVar4.m_getName;
      local_a8 = EVar4.m_value;
      local_a0 = local_b0;
      local_98 = local_a8;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_90,&local_a0);
      std::__cxx11::string::append((string *)local_58);
      std::__cxx11::string::~string((string *)&local_90);
      if (count - 1 != local_70) {
        std::__cxx11::string::append(local_58);
      }
    }
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_230,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_230,(char (*) [46])"InvalidateSubDataTest unexpectedly generated ");
    EVar4 = glu::getErrorStr(attachments_names.field_2._12_4_);
    local_240.m_getName = EVar4.m_getName;
    local_240.m_value = EVar4.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_240);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [35])" error for following attachments [");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_58);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])"]. Test fails.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_230);
    this_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_58);
  }
  return this_local._7_1_;
}

Assistant:

bool InvalidateSubDataTest::CheckErrorAndLog(const glw::GLenum attachments[], glw::GLuint count)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check error. */
	if (glw::GLenum error = gl.getError())
	{
		/* There is an error. Log. */
		std::string attachments_names = "";

		for (glw::GLuint i = 0; i < count; ++i)
		{
			attachments_names.append(glu::getFramebufferAttachmentStr(attachments[i]).toString());

			if ((count - 1) != i)
			{
				attachments_names.append(", ");
			}
		}

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "InvalidateSubDataTest unexpectedly generated "
											<< glu::getErrorStr(error) << " error for following attachments ["
											<< attachments_names << "]. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}